

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O3

FT_Error FT_Bitmap_Embolden(FT_Library library,FT_Bitmap *bitmap,FT_Pos xStrength,FT_Pos yStrength)

{
  uchar *puVar1;
  byte bVar2;
  int iVar3;
  FT_Error FVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  FT_Memory memory;
  uchar *puVar11;
  byte bVar12;
  byte *pbVar13;
  byte *__s;
  uint uVar14;
  uchar *puVar15;
  ulong uVar16;
  ulong uVar17;
  uchar *in;
  byte *pbVar18;
  uchar *__src;
  byte *pbVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  FT_Bitmap tmp;
  FT_Bitmap local_58;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (bitmap == (FT_Bitmap *)0x0) {
    return 6;
  }
  if (bitmap->buffer == (uchar *)0x0) {
    return 6;
  }
  if (0x1fffffffdf < yStrength || 0x1fffffffdf < xStrength) {
    return 6;
  }
  uVar20 = (int)xStrength + 0x20;
  uVar7 = (int)yStrength + 0x20;
  if ((uVar7 | uVar20) < 0x40) goto LAB_0026cc84;
  iVar21 = (int)uVar20 >> 6;
  iVar8 = (int)uVar7 >> 6;
  if ((int)(uVar7 | uVar20) >> 6 < 0) {
    return 6;
  }
  uVar7 = (uint)bitmap->pixel_mode;
  FVar4 = 0;
  switch(uVar7) {
  case 1:
    iVar5 = 8;
    if (iVar21 < 8) {
      iVar5 = iVar21;
    }
    memory = library->memory;
    uVar14 = bitmap->rows;
    uVar10 = bitmap->width;
    uVar20 = bitmap->pitch;
    uVar7 = -uVar20;
    if (0 < (int)uVar20) {
      uVar7 = uVar20;
    }
    uVar16 = (ulong)uVar7;
    iVar21 = iVar5;
    goto switchD_0026c840_caseD_1;
  case 3:
  case 4:
    local_58.buffer = (uchar *)0x0;
    local_58.num_grays = 0;
    local_58.pixel_mode = '\0';
    local_58.palette_mode = '\0';
    local_58._28_4_ = 0;
    local_58.rows = 0;
    local_58.width = 0;
    local_58.pitch = 0;
    local_58._12_4_ = 0;
    local_58.palette = (void *)0x0;
    FVar4 = FT_Bitmap_Convert(library,bitmap,&local_58,1);
    if (FVar4 != 0) {
      return FVar4;
    }
    ft_mem_free(library->memory,bitmap->buffer);
    bitmap->palette = local_58.palette;
    bitmap->buffer = local_58.buffer;
    bitmap->num_grays = local_58.num_grays;
    bitmap->pixel_mode = local_58.pixel_mode;
    bitmap->palette_mode = local_58.palette_mode;
    *(undefined4 *)&bitmap->field_0x1c = local_58._28_4_;
    bitmap->rows = local_58.rows;
    bitmap->width = local_58.width;
    bitmap->pitch = local_58.pitch;
    *(undefined4 *)&bitmap->field_0xc = local_58._12_4_;
    uVar7 = (uint)bitmap->pixel_mode;
    break;
  case 5:
    iVar21 = iVar21 * 3;
    goto LAB_0026c8b1;
  case 6:
    iVar8 = iVar8 * 3;
LAB_0026c8b1:
    memory = library->memory;
    uVar14 = bitmap->rows;
    uVar10 = bitmap->width;
    uVar20 = bitmap->pitch;
    uVar16 = (ulong)-uVar20;
    if (0 < (int)uVar20) {
      uVar16 = (ulong)uVar20;
    }
    goto switchD_0026c840_caseD_2;
  case 7:
    goto switchD_0026c7a8_caseD_7;
  }
  uVar20 = bitmap->pitch;
  uVar14 = -uVar20;
  if (0 < (int)uVar20) {
    uVar14 = uVar20;
  }
  uVar16 = (ulong)uVar14;
  if (uVar7 - 1 < 6) {
    memory = library->memory;
    uVar14 = bitmap->rows;
    uVar10 = bitmap->width;
    switch(uVar7) {
    case 1:
switchD_0026c840_caseD_1:
      uVar7 = uVar10 + iVar21 + 7 >> 3;
      iVar5 = 1;
      break;
    default:
switchD_0026c840_caseD_2:
      uVar7 = uVar10 + iVar21;
      iVar5 = 8;
      break;
    case 3:
      uVar7 = uVar10 + iVar21 + 3 >> 2;
      iVar5 = 2;
      break;
    case 4:
      uVar7 = uVar10 + iVar21 + 1 >> 1;
      iVar5 = 4;
    }
    uVar9 = (uint)uVar16;
    if ((iVar8 == 0) && (uVar7 <= uVar9)) {
      uVar7 = iVar5 * (uVar10 + iVar21);
      if ((uVar7 < uVar9 * 8) && (uVar14 != 0)) {
        pbVar13 = bitmap->buffer + (uVar7 >> 3);
        pbVar18 = bitmap->buffer + uVar16;
        pbVar19 = pbVar18;
        do {
          __s = pbVar13;
          if ((uVar7 & 7) != 0) {
            *pbVar13 = *pbVar13 & (byte)(0xff00 >> ((byte)uVar7 & 7));
            __s = pbVar13 + 1;
          }
          if (__s < pbVar18) {
            memset(__s,0,(long)pbVar19 - (long)__s);
          }
          pbVar13 = pbVar13 + uVar16;
          pbVar19 = pbVar19 + uVar16;
          pbVar18 = pbVar18 + uVar16;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
        uVar20 = bitmap->pitch;
      }
    }
    else {
      puVar15 = (uchar *)ft_mem_qrealloc(memory,(ulong)uVar7,0,(ulong)(uVar14 + iVar8),(void *)0x0,
                                         (FT_Error *)&local_58);
      if (local_58.rows != 0) {
        return local_58.rows;
      }
      __src = bitmap->buffer;
      uVar9 = bitmap->rows * uVar9;
      puVar1 = __src + uVar9;
      if (bitmap->pitch < 1) {
        puVar11 = puVar15;
        if (uVar9 != 0) {
          uVar20 = iVar5 * uVar10 + 7 >> 3;
          do {
            memcpy(puVar11,__src,(ulong)uVar20);
            __src = __src + uVar16;
            memset(puVar11 + uVar20,0,(ulong)(uVar7 - uVar20));
            puVar11 = puVar11 + uVar20 + (uVar7 - uVar20);
          } while (__src < puVar1);
        }
        memset(puVar11,0,(ulong)(uVar7 * iVar8));
      }
      else {
        memset(puVar15,0,(ulong)(uVar7 * iVar8));
        if (uVar9 != 0) {
          puVar11 = puVar15 + uVar7 * iVar8;
          uVar20 = iVar5 * uVar10 + 7 >> 3;
          do {
            memcpy(puVar11,__src,(ulong)uVar20);
            __src = __src + uVar16;
            memset(puVar11 + uVar20,0,(ulong)(uVar7 - uVar20));
            puVar11 = puVar11 + uVar20 + (uVar7 - uVar20);
          } while (__src < puVar1);
        }
      }
      ft_mem_free(memory,bitmap->buffer);
      bitmap->buffer = puVar15;
      uVar20 = -uVar7;
      if (-1 < bitmap->pitch) {
        uVar20 = uVar7;
      }
      bitmap->pitch = uVar20;
    }
    if ((int)uVar20 < 1) {
      uVar20 = -uVar20;
      uVar7 = bitmap->rows;
      puVar15 = bitmap->buffer + (uVar7 - 1) * uVar20;
    }
    else {
      puVar15 = bitmap->buffer + uVar20 * iVar8;
      uVar7 = bitmap->rows;
    }
    uVar14 = 0;
    if (uVar7 != 0) {
      uVar7 = 0;
      do {
        uVar16 = (ulong)uVar20;
        uVar14 = uVar20 - 2;
        if (uVar20 != 0) {
          do {
            uVar17 = uVar16 - 1;
            if (0 < iVar21) {
              bVar2 = puVar15[uVar16 - 1];
              uVar9 = (uint)bVar2;
              iVar5 = 1;
              bVar12 = 7;
              uVar10 = uVar14;
              do {
                if (bitmap->pixel_mode == '\x01') {
                  bVar6 = (byte)uVar9 | bVar2 >> ((byte)iVar5 & 0x1f);
                  uVar9 = (uint)bVar6;
                  puVar15[uVar16 - 1] = bVar6;
                  if (uVar16 != 1) {
                    bVar6 = bVar6 | puVar15[uVar16 - 2] << (bVar12 & 0x1f);
                    uVar9 = (uint)bVar6;
                    puVar15[uVar16 - 1] = bVar6;
                  }
                }
                else {
                  if ((int)uVar10 < 0) break;
                  uVar9 = (uint)puVar15[uVar10] + (uVar9 & 0xff);
                  if (bitmap->num_grays <= uVar9) {
                    puVar15[uVar17] = (char)bitmap->num_grays + 0xff;
                    break;
                  }
                  puVar15[uVar17] = (uchar)uVar9;
                  if ((uVar9 & 0xff) == bitmap->num_grays - 1) break;
                }
                if (iVar21 <= iVar5) break;
                iVar5 = iVar5 + 1;
                uVar10 = uVar10 - 1;
                bVar12 = bVar12 - 1;
              } while( true );
            }
            uVar14 = uVar14 - 1;
            bVar22 = 1 < (long)uVar16;
            uVar16 = uVar17;
          } while (bVar22);
        }
        if (0 < iVar8) {
          iVar5 = 1;
          do {
            if (uVar20 != 0) {
              iVar3 = bitmap->pitch;
              uVar16 = 0;
              do {
                puVar15[uVar16 - (long)(iVar3 * iVar5)] =
                     puVar15[uVar16 - (long)(iVar3 * iVar5)] | puVar15[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar20 != uVar16);
            }
            bVar22 = iVar5 != iVar8;
            iVar5 = iVar5 + 1;
          } while (bVar22);
        }
        puVar15 = puVar15 + bitmap->pitch;
        uVar7 = uVar7 + 1;
        uVar14 = bitmap->rows;
      } while (uVar7 < uVar14);
    }
    bitmap->width = bitmap->width + iVar21;
    bitmap->rows = uVar14 + iVar8;
LAB_0026cc84:
    FVar4 = 0;
  }
  else {
    FVar4 = 0x12;
  }
switchD_0026c7a8_caseD_7:
  return FVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Embolden( FT_Library  library,
                      FT_Bitmap*  bitmap,
                      FT_Pos      xStrength,
                      FT_Pos      yStrength )
  {
    FT_Error        error;
    unsigned char*  p;
    FT_Int          i, x, pitch;
    FT_UInt         y;
    FT_Int          xstr, ystr;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap || !bitmap->buffer )
      return FT_THROW( Invalid_Argument );

    if ( ( ( FT_PIX_ROUND( xStrength ) >> 6 ) > FT_INT_MAX ) ||
         ( ( FT_PIX_ROUND( yStrength ) >> 6 ) > FT_INT_MAX ) )
      return FT_THROW( Invalid_Argument );

    xstr = (FT_Int)FT_PIX_ROUND( xStrength ) >> 6;
    ystr = (FT_Int)FT_PIX_ROUND( yStrength ) >> 6;

    if ( xstr == 0 && ystr == 0 )
      return FT_Err_Ok;
    else if ( xstr < 0 || ystr < 0 )
      return FT_THROW( Invalid_Argument );

    switch ( bitmap->pixel_mode )
    {
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
      {
        FT_Bitmap  tmp;


        /* convert to 8bpp */
        FT_Bitmap_Init( &tmp );
        error = FT_Bitmap_Convert( library, bitmap, &tmp, 1 );
        if ( error )
          return error;

        FT_Bitmap_Done( library, bitmap );
        *bitmap = tmp;
      }
      break;

    case FT_PIXEL_MODE_MONO:
      if ( xstr > 8 )
        xstr = 8;
      break;

    case FT_PIXEL_MODE_LCD:
      xstr *= 3;
      break;

    case FT_PIXEL_MODE_LCD_V:
      ystr *= 3;
      break;

    case FT_PIXEL_MODE_BGRA:
      /* We don't embolden color glyphs. */
      return FT_Err_Ok;
    }

    error = ft_bitmap_assure_buffer( library->memory, bitmap,
                                     (FT_UInt)xstr, (FT_UInt)ystr );
    if ( error )
      return error;

    /* take care of bitmap flow */
    pitch = bitmap->pitch;
    if ( pitch > 0 )
      p = bitmap->buffer + pitch * ystr;
    else
    {
      pitch = -pitch;
      p = bitmap->buffer + (FT_UInt)pitch * ( bitmap->rows - 1 );
    }

    /* for each row */
    for ( y = 0; y < bitmap->rows; y++ )
    {
      /*
       * Horizontally:
       *
       * From the last pixel on, make each pixel or'ed with the
       * `xstr' pixels before it.
       */
      for ( x = pitch - 1; x >= 0; x-- )
      {
        unsigned char  tmp;


        tmp = p[x];
        for ( i = 1; i <= xstr; i++ )
        {
          if ( bitmap->pixel_mode == FT_PIXEL_MODE_MONO )
          {
            p[x] |= tmp >> i;

            /* the maximum value of 8 for `xstr' comes from here */
            if ( x > 0 )
              p[x] |= p[x - 1] << ( 8 - i );

#if 0
            if ( p[x] == 0xFF )
              break;
#endif
          }
          else
          {
            if ( x - i >= 0 )
            {
              if ( p[x] + p[x - i] > bitmap->num_grays - 1 )
              {
                p[x] = (unsigned char)( bitmap->num_grays - 1 );
                break;
              }
              else
              {
                p[x] = (unsigned char)( p[x] + p[x - i] );
                if ( p[x] == bitmap->num_grays - 1 )
                  break;
              }
            }
            else
              break;
          }
        }
      }

      /*
       * Vertically:
       *
       * Make the above `ystr' rows or'ed with it.
       */
      for ( x = 1; x <= ystr; x++ )
      {
        unsigned char*  q;


        q = p - bitmap->pitch * x;
        for ( i = 0; i < pitch; i++ )
          q[i] |= p[i];
      }

      p += bitmap->pitch;
    }

    bitmap->width += (FT_UInt)xstr;
    bitmap->rows += (FT_UInt)ystr;

    return FT_Err_Ok;
  }